

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

void QtPrivate::QDebugStreamOperatorForType<QItemSelection,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  QItemSelectionRange **debug;
  long in_FS_OFFSET;
  QList<QItemSelectionRange> local_28;
  
  local_28.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)dbg->stream;
  *(int *)((long)local_28.d.d + 0x28) = *(int *)((long)local_28.d.d + 0x28) + 1;
  debug = &local_28.d.ptr;
  ::operator<<((QDebug)debug,&local_28);
  QDebug::~QDebug((QDebug *)debug);
  QDebug::~QDebug((QDebug *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28.d.size) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }